

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPrinters.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* (anonymous_namespace)::streamToLines_abi_cxx11_(istream *input)

{
  bool bVar1;
  istream *this;
  istream *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  undefined7 in_stack_ffffffffffffff98;
  string local_38 [39];
  byte local_11;
  istream *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x26d5c5);
  std::__cxx11::string::string(local_38);
  while( true ) {
    this = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(this + *(long *)(*(long *)this + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
  }
  local_11 = 1;
  std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> streamToLines(std::istream& input)
{
  std::vector<std::string> result;
  std::string line;
  while (std::getline(input, line))
  {
    result.push_back(std::move(line));
  }
  return result;
}